

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParseURISafe(char *str,xmlURIPtr *uriOut)

{
  int iVar1;
  xmlURIPtr uri;
  
  iVar1 = 1;
  if ((uriOut != (xmlURIPtr *)0x0) && (*uriOut = (xmlURIPtr)0x0, str != (char *)0x0)) {
    uri = (xmlURIPtr)(*xmlMalloc)(0x58);
    if (uri == (xmlURIPtr)0x0) {
      uri = (xmlURIPtr)0x0;
    }
    else {
      uri->fragment = (char *)0x0;
      *(undefined8 *)&uri->cleanup = 0;
      uri->path = (char *)0x0;
      uri->query = (char *)0x0;
      uri->user = (char *)0x0;
      *(undefined8 *)&uri->port = 0;
      uri->authority = (char *)0x0;
      uri->server = (char *)0x0;
      uri->scheme = (char *)0x0;
      uri->opaque = (char *)0x0;
      uri->query_raw = (char *)0x0;
    }
    if (uri == (xmlURIPtr)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = xmlParse3986URIReference(uri,str);
      if (iVar1 == 0) {
        *uriOut = uri;
        iVar1 = 0;
      }
      else {
        xmlFreeURI(uri);
      }
    }
  }
  return iVar1;
}

Assistant:

int
xmlParseURISafe(const char *str, xmlURIPtr *uriOut) {
    xmlURIPtr uri;
    int ret;

    if (uriOut == NULL)
        return(1);
    *uriOut = NULL;
    if (str == NULL)
	return(1);

    uri = xmlCreateURI();
    if (uri == NULL)
        return(-1);

    ret = xmlParse3986URIReference(uri, str);
    if (ret) {
        xmlFreeURI(uri);
        return(ret);
    }

    *uriOut = uri;
    return(0);
}